

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O1

void __thiscall
GeneticAlgorithm::initializePopulation(GeneticAlgorithm *this,shared_ptr<Instance> *instance)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<Individual,_std::allocator<Individual>_> *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<Individual,_std::allocator<Individual>_> *__tmp;
  int iVar3;
  Greedy greedy;
  LongestProcessingTimeFirst lptf;
  Result greedyResult;
  Result lptfResult;
  shared_ptr<Instance> local_f8;
  shared_ptr<Instance> local_e8;
  shared_ptr<Instance> local_d8;
  Greedy local_c8;
  LongestProcessingTimeFirst local_c0;
  Result local_b8;
  Result local_88;
  Individual local_58;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010abe0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->population).
  super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var2 + 1);
  this_00 = (this->population).
            super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->population).
  super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (2 < this->destinatedPopulationSize) {
    iVar3 = 0;
    do {
      pvVar1 = (this->population).
               super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Individual::makeRandom((Individual *)&local_88,&local_d8);
      std::vector<Individual,_std::allocator<Individual>_>::emplace_back<Individual>
                (pvVar1,(Individual *)&local_88);
      if (local_88.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_88.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->destinatedPopulationSize + -2);
  }
  local_c0.super_Greedy.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (Greedy)&PTR__AbstractAlgorithm_0010acd0;
  local_c8.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (AbstractAlgorithm)&PTR__AbstractAlgorithm_0010ac90;
  local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  LongestProcessingTimeFirst::operator()(&local_88,&local_c0,&local_e8);
  if (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pvVar1 = (this->population).
           super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  Individual::Individual((Individual *)&local_b8,&local_88);
  std::vector<Individual,_std::allocator<Individual>_>::emplace_back<Individual>
            (pvVar1,(Individual *)&local_b8);
  if (local_b8.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b8.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b8.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  Greedy::operator()(&local_b8,&local_c8,&local_f8);
  if (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pvVar1 = (this->population).
           super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  Individual::Individual(&local_58,&local_b8);
  std::vector<Individual,_std::allocator<Individual>_>::emplace_back<Individual>(pvVar1,&local_58);
  if (local_58.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<Core,_std::allocator<Core>_>::~vector(&local_b8.Cores);
  if (local_88.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<Core,_std::allocator<Core>_>::~vector(&local_88.Cores);
  return;
}

Assistant:

void GeneticAlgorithm::initializePopulation(std::shared_ptr<Instance> instance){
	population = std::make_shared<vector<Individual>>();

	for(int i = 0; i < destinatedPopulationSize-2; i++){
		population->push_back(Individual::makeRandom(instance));
	}

	LongestProcessingTimeFirst lptf;
	Greedy greedy;
	auto lptfResult = lptf(instance);
	population->push_back( (Individual)lptfResult );
	auto greedyResult = greedy(instance);
	population->push_back( (Individual)greedyResult );
}